

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.c
# Opt level: O1

char * UUID_to_string(UUID_T *uuid)

{
  int iVar1;
  char *pcVar2;
  LOGGER_LOG p_Var3;
  
  if (uuid == (UUID_T *)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      pcVar2 = "Invalid argument (uuid is NULL)";
      iVar1 = 0x70;
LAB_001644d7:
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/uuid.c"
                ,"UUID_to_string",iVar1,1,pcVar2);
      return (char *)0x0;
    }
  }
  else {
    pcVar2 = (char *)malloc(0x25);
    if (pcVar2 == (char *)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar2 = "Failed allocating UUID string";
        iVar1 = 0x7c;
        goto LAB_001644d7;
      }
    }
    else {
      iVar1 = sprintf(pcVar2,"%02x%02x%02x%02x-%02x%02x-%02x%02x-%02x%02x-%02x%02x%02x%02x%02x%02x",
                      (ulong)(*uuid)[0],(ulong)(*uuid)[1],(ulong)(*uuid)[2],(ulong)(*uuid)[3],
                      (ulong)(*uuid)[4],(ulong)(*uuid)[5],(ulong)(*uuid)[6],(ulong)(*uuid)[7],
                      (ulong)(*uuid)[8],(ulong)(*uuid)[9],(ulong)(*uuid)[10],(ulong)(*uuid)[0xb],
                      (ulong)(*uuid)[0xc],(ulong)(*uuid)[0xd],(ulong)(*uuid)[0xe],
                      (ulong)(*uuid)[0xf]);
      if (iVar1 == 0x24) {
        return pcVar2;
      }
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/uuid.c"
                  ,"UUID_to_string",0x8c,1,"Failed encoding UUID string");
      }
      free(pcVar2);
    }
  }
  return (char *)0x0;
}

Assistant:

char* UUID_to_string(const UUID_T* uuid)
{
    char* result;
    size_t malloc_size;

    // Codes_SRS_UUID_09_011: [ If uuid is NULL, UUID_to_string shall return a non-zero value ]
    if (uuid == NULL)
    {
        LogError("Invalid argument (uuid is NULL)");
        result = NULL;
    }
    else if ((malloc_size = safe_multiply_size_t(sizeof(char), UUID_STRING_SIZE)) == SIZE_MAX)
    {
        LogError("Invalid malloc size");
        result = NULL;
    }
    // Codes_SRS_UUID_09_012: [ UUID_to_string shall allocate a valid UUID string (uuid_string) as per RFC 4122 ]
    else if ((result = (char*)malloc(malloc_size)) == NULL)
    {
        // Codes_SRS_UUID_09_013: [ If uuid_string fails to be allocated, UUID_to_string shall return NULL ]
        LogError("Failed allocating UUID string");
    }
    else
    {
        unsigned char* uuid_bytes;
        int number_of_chars_written;

        uuid_bytes = (unsigned char*)uuid;

        // Codes_SRS_UUID_09_014: [ Each character in uuid shall be written in the respective positions of uuid_string as a 2-digit HEX value ]  
        number_of_chars_written = sprintf(result, "%" PRI_UUID,
            UUID_FORMAT_VALUES(uuid_bytes));

        if (number_of_chars_written != UUID_STRING_LENGTH)
        {
            // Tests_SRS_UUID_09_015: [ If uuid_string fails to be set, UUID_to_string shall return NULL ]
            LogError("Failed encoding UUID string");
            free(result);
            result = NULL;
        }
    }

    // Codes_SRS_UUID_09_016: [ If no failures occur, UUID_to_string shall return uuid_string ]
    return result;
}